

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::clear(Calendar *this,UCalendarDateFields field)

{
  undefined4 local_18;
  UCalendarDateFields local_14;
  UErrorCode ec;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  local_14 = field;
  if (this->fAreFieldsVirtuallySet != '\0') {
    local_18 = 0;
    _ec = this;
    (*(this->super_UObject)._vptr_UObject[0x1d])(this,&local_18);
  }
  this->fFields[local_14] = 0;
  this->fStamp[local_14] = 0;
  this->fIsSet[local_14] = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fIsTimeSet = '\0';
  return;
}

Assistant:

void
Calendar::clear(UCalendarDateFields field)
{
    if (fAreFieldsVirtuallySet) {
        UErrorCode ec = U_ZERO_ERROR;
        computeFields(ec);
    }
    fFields[field]         = 0;
    fStamp[field]         = kUnset;
    fIsSet[field]         = FALSE; // Remove later
    fIsTimeSet = fAreFieldsSet = fAreAllFieldsSet = fAreFieldsVirtuallySet = FALSE;
}